

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O3

int8_t __thiscall
icu_63::UnicodeString::doCompareCodePointOrder
          (UnicodeString *this,int32_t start,int32_t length,UChar *srcChars,int32_t srcStart,
          int32_t srcLength)

{
  ushort uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  UChar *s2;
  int iVar6;
  int32_t length1;
  char16_t *pcVar7;
  bool bVar8;
  
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  bVar2 = 0xff;
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      iVar6 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)(short)uVar1 >> 5;
    }
    iVar3 = start;
    if (iVar6 < start) {
      iVar3 = iVar6;
    }
    if (start < 0) {
      iVar3 = 0;
    }
    length1 = iVar6 - iVar3;
    if (length <= iVar6 - iVar3) {
      length1 = length;
    }
    if (length < 0) {
      length1 = 0;
    }
    if ((uVar1 & 2) == 0) {
      pcVar7 = (this->fUnion).fFields.fArray;
    }
    else {
      pcVar7 = (char16_t *)((long)&this->fUnion + 2);
    }
    bVar8 = srcChars == (UChar *)0x0;
    if (bVar8) {
      srcLength = 0;
    }
    lVar5 = (long)srcStart;
    if (bVar8) {
      lVar5 = 0;
    }
    s2 = srcChars + lVar5;
    if (bVar8) {
      s2 = (UChar *)0x0;
    }
    uVar4 = uprv_strCompare_63(pcVar7 + iVar3,length1,s2,srcLength,'\0','\x01');
    bVar2 = (byte)(uVar4 >> 0xf) | 1;
    if (uVar4 == 0) {
      bVar2 = 0;
    }
  }
  return bVar2;
}

Assistant:

inline UBool
UnicodeString::isBogus() const
{ return (UBool)(fUnion.fFields.fLengthAndFlags & kIsBogus); }